

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DES.cpp
# Opt level: O0

SequenceD<64> * __thiscall
DESinv::operator()(SequenceD<64> *__return_storage_ptr__,DESinv *this,SequenceD<64> *seq)

{
  Sequence *pSVar1;
  Sequence *t_right;
  Permutation<64,_64> local_431;
  undefined1 local_430 [8];
  SequenceD<64> swapSeq;
  Sequence local_2d0;
  undefined1 local_278 [8];
  Sequence xorSeq;
  Sequence tempSeq;
  int i;
  Permutation<64,_64> local_1b1;
  undefined1 local_1b0 [8];
  SequenceD<64> tmp;
  Finv f_inv;
  SequenceD<64> *seq_local;
  DESinv *this_local;
  
  Finv::Finv((Finv *)((long)&tmp.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl
                             .super__Deque_impl_data._M_finish + 0x18),&this->m_key);
  Permutation<64,_64>::operator()((SequenceD<64> *)local_1b0,&local_1b1,seq,&INITIAL_PERMUTATION);
  for (tempSeq.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_node._0_4_ = 0;
      (int)tempSeq.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_node < 0x10;
      tempSeq.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_node._0_4_ =
           (int)tempSeq.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node + 1) {
    pSVar1 = SequenceD<64>::right((SequenceD<64> *)local_1b0);
    Finv::operator()((Sequence *)
                     &xorSeq.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_node,
                     (Finv *)((long)&tmp.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>
                                     ._M_impl.super__Deque_impl_data._M_finish + 0x18),pSVar1);
    pSVar1 = SequenceD<64>::left((SequenceD<64> *)local_1b0);
    Sequence::Sequence(&local_2d0,
                       (Sequence *)
                       &xorSeq.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_node);
    Sequence::operator*((Sequence *)local_278,pSVar1,&local_2d0);
    Sequence::~Sequence(&local_2d0);
    pSVar1 = SequenceD<64>::right((SequenceD<64> *)local_1b0);
    SequenceD<64>::SequenceD
              ((SequenceD<64> *)
               ((long)&swapSeq.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                       super__Deque_impl_data._M_finish + 0x18),pSVar1,(Sequence *)local_278);
    SequenceD<64>::operator=
              ((SequenceD<64> *)local_1b0,
               (SequenceD<64> *)
               ((long)&swapSeq.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                       super__Deque_impl_data._M_finish + 0x18));
    SequenceD<64>::~SequenceD
              ((SequenceD<64> *)
               ((long)&swapSeq.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                       super__Deque_impl_data._M_finish + 0x18));
    Sequence::~Sequence((Sequence *)local_278);
    Sequence::~Sequence((Sequence *)
                        &xorSeq.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_node);
  }
  pSVar1 = SequenceD<64>::right((SequenceD<64> *)local_1b0);
  t_right = SequenceD<64>::left((SequenceD<64> *)local_1b0);
  SequenceD<64>::SequenceD((SequenceD<64> *)local_430,pSVar1,t_right);
  Permutation<64,_64>::operator()
            (__return_storage_ptr__,&local_431,(SequenceD<64> *)local_430,
             &INITIAL_PERMUTATION_REVERSE);
  SequenceD<64>::~SequenceD((SequenceD<64> *)local_430);
  SequenceD<64>::~SequenceD((SequenceD<64> *)local_1b0);
  Finv::~Finv((Finv *)((long)&tmp.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>.
                              _M_impl.super__Deque_impl_data._M_finish + 0x18));
  return __return_storage_ptr__;
}

Assistant:

SequenceD<64> DESinv::operator()(SequenceD<64> seq) {
    Finv f_inv(m_key);
    auto tmp = Permutation<64, 64>{}(seq, INITIAL_PERMUTATION);

    for (int i = 0; i < 16; ++i) {
        auto tempSeq = f_inv(tmp.right());
        auto xorSeq = tmp.left() * tempSeq;
        tmp = SequenceD<64>{tmp.right(), xorSeq};
    }

    auto swapSeq = SequenceD<64>{tmp.right(), tmp.left()};
    return Permutation<64, 64>()(swapSeq, INITIAL_PERMUTATION_REVERSE);
}